

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

wchar_t assertion_file_contents(char *filename,wchar_t line,void *buff,wchar_t s,char *fn)

{
  int iVar1;
  FILE *__stream;
  char *p;
  size_t sVar2;
  wchar_t local_74;
  wchar_t local_64;
  wchar_t n;
  FILE *f;
  char *contents;
  char *fn_local;
  wchar_t s_local;
  void *buff_local;
  wchar_t line_local;
  char *filename_local;
  
  assertion_count(filename,line);
  __stream = fopen(fn,"rb");
  if (__stream == (FILE *)0x0) {
    failure_start(filename,line,"File should exist: %s",fn);
    failure_finish((void *)0x0);
    filename_local._4_4_ = L'\0';
  }
  else {
    p = (char *)malloc((long)(s << 1));
    sVar2 = fread(p,1,(long)(s << 1),__stream);
    local_64 = (wchar_t)sVar2;
    fclose(__stream);
    if ((local_64 == s) && (iVar1 = memcmp(buff,p,(long)s), iVar1 == 0)) {
      free(p);
      filename_local._4_4_ = L'\x01';
    }
    else {
      failure_start(filename,line,"File contents don\'t match");
      logprintf("  file=\"%s\"\n",fn);
      if (local_64 < L'\x01') {
        logprintf("  File empty, contents should be:\n");
        local_74 = s;
        if (L'Ȁ' < s) {
          local_74 = L'Ȁ';
        }
        hexdump((char *)buff,(char *)0x0,(long)local_74,0);
      }
      else {
        if (L'Ȁ' < local_64) {
          local_64 = L'Ȁ';
        }
        hexdump(p,(char *)buff,(long)local_64,0);
      }
      failure_finish((void *)0x0);
      free(p);
      filename_local._4_4_ = L'\0';
    }
  }
  return filename_local._4_4_;
}

Assistant:

int
assertion_file_contents(const char *filename, int line, const void *buff, int s, const char *fn)
{
	char *contents;
	FILE *f;
	int n;

	assertion_count(filename, line);

	f = fopen(fn, "rb");
	if (f == NULL) {
		failure_start(filename, line,
		    "File should exist: %s", fn);
		failure_finish(NULL);
		return (0);
	}
	contents = malloc(s * 2);
	n = (int)fread(contents, 1, s * 2, f);
	fclose(f);
	if (n == s && memcmp(buff, contents, s) == 0) {
		free(contents);
		return (1);
	}
	failure_start(filename, line, "File contents don't match");
	logprintf("  file=\"%s\"\n", fn);
	if (n > 0)
		hexdump(contents, buff, n > 512 ? 512 : n, 0);
	else {
		logprintf("  File empty, contents should be:\n");
		hexdump(buff, NULL, s > 512 ? 512 : s, 0);
	}
	failure_finish(NULL);
	free(contents);
	return (0);
}